

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O3

Table * __thiscall Heuristics::popFromFrontierDFS(Table *__return_storage_ptr__,Heuristics *this)

{
  undefined8 uVar1;
  int iVar2;
  _Elt_pointer pTVar3;
  
  pTVar3 = (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pTVar3 == (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pTVar3 = (this->frontier).c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  iVar2 = pTVar3[-1].evaluationScore;
  __return_storage_ptr__->current_col = pTVar3[-1].current_col;
  __return_storage_ptr__->evaluationScore = iVar2;
  uVar1 = *(undefined8 *)(pTVar3[-1].table[2] + 2);
  *(undefined8 *)__return_storage_ptr__->table = *(undefined8 *)pTVar3[-1].table;
  *(undefined8 *)(__return_storage_ptr__->table[2] + 2) = uVar1;
  std::deque<Table,_std::allocator<Table>_>::pop_back(&(this->frontier).c);
  return __return_storage_ptr__;
}

Assistant:

Table Heuristics::popFromFrontierDFS() {
    Table table = this->frontier.top();
    frontier.pop();
    return table;
}